

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfwsound.c
# Opt level: O0

MMFWSoundEntryFormat MMFWSoundEntry_FormatForEntry(MMFW *mmfw,int i)

{
  char local_1d;
  uint local_1c;
  char result;
  MMFW *pMStack_18;
  int i_local;
  MMFW *mmfw_local;
  
  local_1c = i;
  pMStack_18 = mmfw;
  fseek((FILE *)mmfw->fp,mmfw->kind_metadata_start_pos,0);
  fseek((FILE *)pMStack_18->fp,(ulong)pMStack_18->n_entries << 2,1);
  fseek((FILE *)pMStack_18->fp,2,1);
  fseek((FILE *)pMStack_18->fp,(long)(int)local_1c,1);
  ReadChar(pMStack_18->fp,1,&local_1d);
  if (local_1d == '\x15') {
    mmfw_local._4_4_ = MMFW_SOUND_MONO_S16BE_22050;
  }
  else if (local_1d == '\x1d') {
    mmfw_local._4_4_ = MMFW_SOUND_MONO_S16BE_44100;
  }
  else {
    LPWarn("mmfw","unhandled MMFW Sound entry format %d for entry %d, setting to UNKNOWN",
           (ulong)(uint)(int)local_1d,(ulong)local_1c);
    mmfw_local._4_4_ = MMFW_SOUND_UNKNOWN;
  }
  return mmfw_local._4_4_;
}

Assistant:

MMFWSoundEntryFormat
MMFWSoundEntry_FormatForEntry(MMFW *mmfw, int i)
{
	fseek(mmfw->fp, mmfw->kind_metadata_start_pos, SEEK_SET);

	/* Skip over the "A" metadta. */
	fseek(mmfw->fp, mmfw->n_entries*sizeof(uint32_t), SEEK_CUR);

	/* I think we need this special flag. */
	//uint16_t flag;
	//ReadUint16(mmfw->fp, 1, &flag);
	fseek(mmfw->fp, 2L, SEEK_CUR);

	/* Navigate to the correct entry. */
	fseek(mmfw->fp, i*sizeof(unsigned char), SEEK_CUR);

	char result;
	ReadChar(mmfw->fp, 1, &result);

	switch (result) {
	case 0x15:
		return MMFW_SOUND_MONO_S16BE_22050;
		break;
	case 0x1D:
		return MMFW_SOUND_MONO_S16BE_44100;
		break;
	default:
		LPWarn(LP_SUBSYSTEM_MMFW, "unhandled MMFW Sound entry format %d for entry %d, setting to UNKNOWN", result, i);
		return MMFW_SOUND_UNKNOWN;
	}
}